

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_threading_pthreads.cpp
# Opt level: O3

int __thiscall crnlib::task_pool::init(task_pool *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  uint uVar2;
  undefined8 unaff_RBP;
  uint uVar3;
  
  uVar2 = (uint)ctx;
  uVar3 = 0x40;
  if (uVar2 < 0x40) {
    uVar3 = uVar2;
  }
  deinit(this);
  this->m_num_threads = 0;
  if (uVar2 != 0) {
    uVar2 = 0;
    do {
      iVar1 = pthread_create(this->m_threads + uVar2,(pthread_attr_t *)0x0,thread_func,this);
      if (iVar1 != 0) {
        deinit(this);
        return 0;
      }
      uVar2 = this->m_num_threads + 1;
      this->m_num_threads = uVar2;
    } while (uVar2 < uVar3);
  }
  return (int)CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
}

Assistant:

bool task_pool::init(uint num_threads) {
  CRNLIB_ASSERT(num_threads <= cMaxThreads);
  num_threads = math::minimum<uint>(num_threads, cMaxThreads);

  deinit();

  bool succeeded = true;

  m_num_threads = 0;
  while (m_num_threads < num_threads) {
    int status = pthread_create(&m_threads[m_num_threads], NULL, thread_func, this);
    if (status) {
      succeeded = false;
      break;
    }

    m_num_threads++;
  }

  if (!succeeded) {
    deinit();
    return false;
  }

  return true;
}